

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O0

void __thiscall WorldShuffler::place_fixed_items(WorldShuffler *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  reference name;
  ItemSource *pIVar2;
  Item *pIVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_218;
  string *source_name;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  allocator<char> local_158;
  allocator<char> local_157;
  allocator<char> local_156;
  allocator<char> local_155 [20];
  allocator<char> local_141;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  undefined1 local_38 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  SHOPS_TO_FILL;
  WorldShuffler *this_local;
  
  SHOPS_TO_FILL.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  bVar1 = RandomizerOptions::ensure_ekeeke_in_shops(this->_options);
  if (bVar1) {
    __range2._4_1_ = 1;
    local_140 = &local_138;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"Massan: Shop item #1",&local_141);
    local_140 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_118,"Gumi: Inn item #1",local_155);
    local_140 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_f8,"Ryuma: Inn item",&local_156);
    local_140 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_d8,"Mercator: Shop item #1",&local_157)
    ;
    local_140 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_b8,"Verla: Shop item #1",&local_158);
    local_140 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_98,"Destel: Inn item",(allocator<char> *)((long)&__range2 + 7));
    local_140 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_78,"Route to Lake Shrine: Greedly\'s shop item #1",
               (allocator<char> *)((long)&__range2 + 6));
    local_140 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_58,"Kazalt: Shop item #1",(allocator<char> *)((long)&__range2 + 5));
    __range2._4_1_ = 0;
    local_38._0_8_ = &local_138;
    local_38._8_8_ = 8;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&__range2 + 3));
    __l._M_len = local_38._8_8_;
    __l._M_array = (iterator)local_38._0_8_;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_38 + 0x10),__l,
             (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&__range2 + 3));
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&__range2 + 3));
    local_218 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38;
    do {
      local_218 = local_218 + -1;
      std::__cxx11::string::~string((string *)local_218);
    } while (local_218 != &local_138);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 5));
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 6));
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    std::allocator<char>::~allocator(&local_158);
    std::allocator<char>::~allocator(&local_157);
    std::allocator<char>::~allocator(&local_156);
    std::allocator<char>::~allocator(local_155);
    std::allocator<char>::~allocator(&local_141);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(local_38 + 0x10));
    source_name = (string *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(local_38 + 0x10));
    while (bVar1 = __gnu_cxx::
                   operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&source_name), ((bVar1 ^ 0xffU) & 1) != 0) {
      name = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end2);
      pIVar2 = RandomizerWorld::item_source(this->_world,name);
      pIVar3 = World::item(&this->_world->super_World,'\0');
      (*pIVar2->_vptr_ItemSource[3])(pIVar2,pIVar3);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_38 + 0x10));
  }
  return;
}

Assistant:

void WorldShuffler::place_fixed_items()
{
    if(_options.ensure_ekeeke_in_shops())
    {
        const std::vector<std::string> SHOPS_TO_FILL = {
                "Massan: Shop item #1",
                "Gumi: Inn item #1",
                "Ryuma: Inn item",
                "Mercator: Shop item #1",
                "Verla: Shop item #1",
                "Destel: Inn item",
                "Route to Lake Shrine: Greedly's shop item #1",
                "Kazalt: Shop item #1"
        };
        for(const std::string& source_name : SHOPS_TO_FILL)
            _world.item_source(source_name)->item(_world.item(ITEM_EKEEKE));
    }
}